

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               ParseNodeVisitor<SymCheck> prefix,ParseNodeVisitor<SymCheck> postfix,
               ParseNode *pnodeParent)

{
  code *pcVar1;
  ParseNodeVisitor<SymCheck> postfix_00;
  ParseNodeVisitor<SymCheck> postfix_01;
  ParseNodeVisitor<SymCheck> postfix_02;
  ParseNodeVisitor<SymCheck> prefix_00;
  ParseNodeVisitor<SymCheck> postfix_03;
  ParseNodeVisitor<SymCheck> prefix_01;
  ParseNodeVisitor<SymCheck> postfix_04;
  ParseNodeVisitor<SymCheck> prefix_02;
  ParseNodeVisitor<SymCheck> postfix_05;
  ParseNodeVisitor<SymCheck> prefix_03;
  ParseNodeVisitor<SymCheck> postfix_06;
  ParseNodeVisitor<SymCheck> prefix_04;
  ParseNodeVisitor<SymCheck> postfix_07;
  ParseNodeVisitor<SymCheck> prefix_05;
  ParseNodeVisitor<SymCheck> postfix_08;
  ParseNodeVisitor<SymCheck> prefix_06;
  ParseNodeVisitor<SymCheck> postfix_09;
  ParseNodeVisitor<SymCheck> prefix_07;
  ParseNodeVisitor<SymCheck> postfix_10;
  ParseNodeVisitor<SymCheck> prefix_08;
  ParseNodeVisitor<SymCheck> postfix_11;
  ParseNodeVisitor<SymCheck> prefix_09;
  ParseNodeVisitor<SymCheck> postfix_12;
  ParseNodeVisitor<SymCheck> prefix_10;
  ParseNodeVisitor<SymCheck> postfix_13;
  ParseNodeVisitor<SymCheck> prefix_11;
  ParseNodeVisitor<SymCheck> postfix_14;
  ParseNodeVisitor<SymCheck> prefix_12;
  ParseNodeVisitor<SymCheck> postfix_15;
  ParseNodeVisitor<SymCheck> prefix_13;
  ParseNodeVisitor<SymCheck> postfix_16;
  ParseNodeVisitor<SymCheck> prefix_14;
  ParseNodeVisitor<SymCheck> postfix_17;
  ParseNodeVisitor<SymCheck> prefix_15;
  ParseNodeVisitor<SymCheck> postfix_18;
  ParseNodeVisitor<SymCheck> prefix_16;
  ParseNodeVisitor<SymCheck> postfix_19;
  ParseNodeVisitor<SymCheck> prefix_17;
  ParseNodeVisitor<SymCheck> postfix_20;
  ParseNodeVisitor<SymCheck> prefix_18;
  ParseNodeVisitor<SymCheck> postfix_21;
  ParseNodeVisitor<SymCheck> prefix_19;
  ParseNodeVisitor<SymCheck> prefix_20;
  ParseNodeVisitor<SymCheck> postfix_22;
  ParseNodeVisitor<SymCheck> prefix_21;
  ParseNodeVisitor<SymCheck> postfix_23;
  ParseNodeVisitor<SymCheck> prefix_22;
  ParseNodeVisitor<SymCheck> postfix_24;
  ParseNodeVisitor<SymCheck> prefix_23;
  ParseNodeVisitor<SymCheck> postfix_25;
  ParseNodeVisitor<SymCheck> prefix_24;
  ParseNodeVisitor<SymCheck> postfix_26;
  ParseNodeVisitor<SymCheck> prefix_25;
  ParseNodeVisitor<SymCheck> postfix_27;
  ParseNodeVisitor<SymCheck> prefix_26;
  ParseNodeVisitor<SymCheck> postfix_28;
  ParseNodeVisitor<SymCheck> prefix_27;
  ParseNodeVisitor<SymCheck> postfix_29;
  ParseNodeVisitor<SymCheck> prefix_28;
  ParseNodeVisitor<SymCheck> postfix_30;
  ParseNodeVisitor<SymCheck> prefix_29;
  ParseNodeVisitor<SymCheck> postfix_31;
  ParseNodeVisitor<SymCheck> prefix_30;
  ParseNodeVisitor<SymCheck> postfix_32;
  ParseNodeVisitor<SymCheck> prefix_31;
  ParseNodeVisitor<SymCheck> postfix_33;
  ParseNodeVisitor<SymCheck> prefix_32;
  ParseNodeVisitor<SymCheck> postfix_34;
  ParseNodeVisitor<SymCheck> prefix_33;
  ParseNodeVisitor<SymCheck> postfix_35;
  ParseNodeVisitor<SymCheck> prefix_34;
  ParseNodeVisitor<SymCheck> postfix_36;
  ParseNodeVisitor<SymCheck> prefix_35;
  ParseNodeVisitor<SymCheck> postfix_37;
  ParseNodeVisitor<SymCheck> prefix_36;
  ParseNodeVisitor<SymCheck> prefix_37;
  ParseNodeVisitor<SymCheck> postfix_38;
  ParseNodeVisitor<SymCheck> prefix_38;
  ParseNodeVisitor<SymCheck> postfix_39;
  ParseNodeVisitor<SymCheck> prefix_39;
  ParseNodeVisitor<SymCheck> postfix_40;
  ParseNodeVisitor<SymCheck> prefix_40;
  ParseNodeVisitor<SymCheck> postfix_41;
  ParseNodeVisitor<SymCheck> prefix_41;
  ParseNodeVisitor<SymCheck> postfix_42;
  ParseNodeVisitor<SymCheck> prefix_42;
  ParseNodeVisitor<SymCheck> postfix_43;
  ParseNodeVisitor<SymCheck> prefix_43;
  ParseNodeVisitor<SymCheck> postfix_44;
  ParseNodeVisitor<SymCheck> prefix_44;
  ParseNodeVisitor<SymCheck> postfix_45;
  ParseNodeVisitor<SymCheck> prefix_45;
  ParseNodeVisitor<SymCheck> postfix_46;
  ParseNodeVisitor<SymCheck> prefix_46;
  ParseNodeVisitor<SymCheck> postfix_47;
  ParseNodeVisitor<SymCheck> prefix_47;
  ParseNodeVisitor<SymCheck> postfix_48;
  ParseNodeVisitor<SymCheck> prefix_48;
  ParseNodeVisitor<SymCheck> postfix_49;
  ParseNodeVisitor<SymCheck> prefix_49;
  ParseNodeVisitor<SymCheck> postfix_50;
  ParseNodeVisitor<SymCheck> prefix_50;
  ParseNodeVisitor<SymCheck> postfix_51;
  ParseNodeVisitor<SymCheck> prefix_51;
  ParseNodeVisitor<SymCheck> postfix_52;
  ParseNodeVisitor<SymCheck> prefix_52;
  ParseNodeVisitor<SymCheck> postfix_53;
  ParseNodeVisitor<SymCheck> prefix_53;
  ParseNodeVisitor<SymCheck> postfix_54;
  ParseNodeVisitor<SymCheck> prefix_54;
  ParseNodeVisitor<SymCheck> postfix_55;
  ParseNodeVisitor<SymCheck> prefix_55;
  ParseNodeVisitor<SymCheck> postfix_56;
  ParseNodeVisitor<SymCheck> prefix_56;
  ParseNodeVisitor<SymCheck> postfix_57;
  ParseNodeVisitor<SymCheck> prefix_57;
  ParseNodeVisitor<SymCheck> postfix_58;
  ParseNodeVisitor<SymCheck> prefix_58;
  ParseNodeVisitor<SymCheck> postfix_59;
  ParseNodeVisitor<SymCheck> prefix_59;
  ParseNodeVisitor<SymCheck> postfix_60;
  ParseNodeVisitor<SymCheck> prefix_60;
  ParseNodeVisitor<SymCheck> postfix_61;
  ParseNodeVisitor<SymCheck> prefix_61;
  ParseNodeVisitor<SymCheck> postfix_62;
  ParseNodeVisitor<SymCheck> prefix_62;
  ParseNodeVisitor<SymCheck> postfix_63;
  ParseNodeVisitor<SymCheck> prefix_63;
  ByteCodeGenerator *pnode_00;
  bool bVar2;
  ScriptContext *scriptContext;
  ParseNodeUni *pPVar3;
  ParseNodeBin *pPVar4;
  ParseNodeSuperReference *pPVar5;
  ParseNodeParamPattern *pPVar6;
  ParseNodeSuperCall *pPVar7;
  ParseNodeCall *pPVar8;
  ParseNodeTri *pPVar9;
  ParseNodeVar *pPVar10;
  ParseNodeClass *pPVar11;
  ParseNodeStrTemplate *pPVar12;
  ParseNodeExportDefault *pPVar13;
  ParseNodeFnc *pPVar14;
  undefined4 *puVar15;
  ParseNodeProg *pPVar16;
  ParseNodeFor *pPVar17;
  ParseNodeIf *pPVar18;
  ParseNodeWhile *pPVar19;
  ParseNodeForInOrForOf *pPVar20;
  ParseNodeReturn *pPVar21;
  ParseNodeBlock *pnode_01;
  ParseNode *pPVar22;
  ParseNodeWith *pPVar23;
  ParseNodeSwitch *pPVar24;
  ParseNodeCase *pPVar25;
  ParseNodeTryFinally *pPVar26;
  ParseNodeTryCatch *pPVar27;
  ParseNodeTry *pPVar28;
  ParseNodeCatch *pPVar29;
  ParseNodePtr pnode_02;
  ParseNodeFinally *pPVar30;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *p_Var31;
  ParseNode *pnodeRhs;
  undefined1 local_808 [8];
  SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> rhsStack;
  ArenaAllocator *alloc;
  ParseNode *pnode1;
  bool arrayLitOpt;
  ParseNodeCase *local_5f8;
  ParseNodeCase *pnodeT;
  ParseNodeBlock *pnodeBlock;
  uint local_384;
  ParseNode *pPStack_380;
  uint i;
  SymCheck *local_378;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_370;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_368;
  ParseNode *local_360;
  SymCheck *local_358;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_350;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_348;
  ParseNode *local_340;
  SymCheck *local_338;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_330;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_328;
  ParseNode *local_320;
  SymCheck *local_318;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_310;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_308;
  ParseNode *local_300;
  SymCheck *local_2f8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_2f0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_2e8;
  ParseNode *local_2e0;
  SymCheck *local_2d8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_2d0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_2c8;
  ParseNode *local_2c0;
  SymCheck *local_2b8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_2b0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_2a8;
  ParseNode *local_2a0;
  SymCheck *local_298;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_290;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_288;
  ParseNode *local_280;
  SymCheck *local_278;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_270;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_268;
  ParseNode *local_260;
  SymCheck *local_258;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_250;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_248;
  ParseNode *local_240;
  SymCheck *local_238;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_230;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_228;
  ParseNode *local_220;
  SymCheck *local_218;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_210;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_208;
  ParseNode *local_200;
  SymCheck *local_1f8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1f0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1e8;
  ParseNode *local_1e0;
  SymCheck *local_1d8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1d0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1c8;
  ParseNode *local_1c0;
  SymCheck *local_1b8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1b0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1a8;
  ParseNode *local_1a0;
  SymCheck *local_198;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_190;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_188;
  ParseNode *local_180;
  SymCheck *local_178;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_170;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_168;
  ParseNode *local_160;
  SymCheck *local_158;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_150;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_148;
  ParseNode *local_140;
  SymCheck *local_138;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_130;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_128;
  ParseNode *local_120;
  SymCheck *local_118;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_110;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_108;
  ParseNode *local_100;
  SymCheck *local_f8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_f0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_e8;
  ParseNode *local_e0;
  SymCheck *local_d8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_d0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_c8;
  ParseNode *local_c0;
  SymCheck *local_b8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_b0;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_a8;
  ParseNode *local_a0;
  SymCheck *local_98;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_90;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_88;
  ParseNode *local_80;
  SymCheck *local_78;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_70;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_68;
  ParseNode *local_60;
  SymCheck *local_58;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_50;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_48;
  uint local_3c;
  ByteCodeGenerator *pBStack_38;
  uint flags;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  ParseNodeVisitor<SymCheck> postfix_local;
  ParseNodeVisitor<SymCheck> prefix_local;
  
  postfix_local.m_context = (SymCheck *)postfix.m_fn;
  pnode_local = (ParseNode *)postfix.m_context;
  p_Var31 = prefix.m_fn;
  postfix_local.m_fn =
       (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix.m_context;
  if (pnode != (ParseNode *)0x0) {
    pBStack_38 = byteCodeGenerator;
    byteCodeGenerator_local = (ByteCodeGenerator *)pnode;
    scriptContext = ByteCodeGenerator::GetScriptContext(byteCodeGenerator);
    ThreadContext::ProbeCurrentStackNoDispose(0x2400,scriptContext);
    ParseNodeVisitor<SymCheck>::operator()
              ((ParseNodeVisitor<SymCheck> *)&postfix_local.m_fn,
               (ParseNode *)byteCodeGenerator_local,pBStack_38);
    switch(*(undefined1 *)&byteCodeGenerator_local->scriptContext) {
    case 0x16:
      pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
      prefix_14.m_fn = p_Var31;
      prefix_14.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_16.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_16.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar3->pnode1,pBStack_38,prefix_14,postfix_16,(ParseNode *)0x0);
      break;
    default:
      local_3c = ParseNode::Grfnop((uint)*(byte *)&byteCodeGenerator_local->scriptContext);
      if ((local_3c & 4) == 0) {
        if ((local_3c & 8) != 0) {
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
          local_70 = postfix_local.m_fn;
          local_80 = pnode_local;
          local_78 = postfix_local.m_context;
          prefix_62.m_fn = p_Var31;
          prefix_62.m_context = (SymCheck *)postfix_local.m_fn;
          postfix_62.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
               postfix_local.m_context;
          postfix_62.m_context = (SymCheck *)pnode_local;
          local_68 = p_Var31;
          Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    (pPVar4->pnode1,pBStack_38,prefix_62,postfix_62,(ParseNode *)0x0);
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
          local_90 = postfix_local.m_fn;
          local_a0 = pnode_local;
          local_98 = postfix_local.m_context;
          prefix_61.m_fn = p_Var31;
          prefix_61.m_context = (SymCheck *)postfix_local.m_fn;
          postfix_61.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
               postfix_local.m_context;
          postfix_61.m_context = (SymCheck *)pnode_local;
          local_88 = p_Var31;
          Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    (pPVar4->pnode2,pBStack_38,prefix_61,postfix_61,(ParseNode *)0x0);
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
          bVar2 = ByteCodeGenerator::IsSuper(pPVar4->pnode1);
          if (bVar2) {
            pPVar5 = ParseNode::AsParseNodeSuperReference((ParseNode *)byteCodeGenerator_local);
            local_b0 = postfix_local.m_fn;
            local_c0 = pnode_local;
            local_b8 = postfix_local.m_context;
            prefix_60.m_fn = p_Var31;
            prefix_60.m_context = (SymCheck *)postfix_local.m_fn;
            postfix_60.m_fn =
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
                 postfix_local.m_context;
            postfix_60.m_context = (SymCheck *)pnode_local;
            local_a8 = p_Var31;
            Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                      ((ParseNode *)pPVar5->pnodeThis,pBStack_38,prefix_60,postfix_60,
                       (ParseNode *)0x0);
          }
        }
      }
      else {
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        local_50 = postfix_local.m_fn;
        local_60 = pnode_local;
        local_58 = postfix_local.m_context;
        prefix_63.m_fn = p_Var31;
        prefix_63.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_63.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_63.m_context = (SymCheck *)pnode_local;
        local_48 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar3->pnode1,pBStack_38,prefix_63,postfix_63,(ParseNode *)0x0);
      }
      break;
    case 0x19:
      bVar2 = EmitAsConstantArray((ParseNode *)byteCodeGenerator_local,pBStack_38);
      if (!bVar2) {
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        prefix_04.m_fn = p_Var31;
        prefix_04.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_06.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_06.m_context = (SymCheck *)pnode_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar3->pnode1,pBStack_38,prefix_04,postfix_06,(ParseNode *)0x0);
      }
      break;
    case 0x2f:
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      local_130 = postfix_local.m_fn;
      local_140 = pnode_local;
      local_138 = postfix_local.m_context;
      prefix_56.m_fn = p_Var31;
      prefix_56.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_56.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_56.m_context = (SymCheck *)pnode_local;
      local_128 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar8->pnodeTarget,pBStack_38,prefix_56,postfix_56,(ParseNode *)0x0);
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      local_150 = postfix_local.m_fn;
      local_160 = pnode_local;
      local_158 = postfix_local.m_context;
      prefix_55.m_fn = p_Var31;
      prefix_55.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_55.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_55.m_context = (SymCheck *)pnode_local;
      local_148 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar8->pnodeArgs,pBStack_38,prefix_55,postfix_55,(ParseNode *)0x0);
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      if (((byte)pPVar8->field_0x24 >> 3 & 1) != 0) {
        pPVar7 = ParseNode::AsParseNodeSuperCall((ParseNode *)byteCodeGenerator_local);
        local_170 = postfix_local.m_fn;
        local_180 = pnode_local;
        local_178 = postfix_local.m_context;
        prefix_54.m_fn = p_Var31;
        prefix_54.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_54.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_54.m_context = (SymCheck *)pnode_local;
        local_168 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  ((ParseNode *)pPVar7->pnodeThis,pBStack_38,prefix_54,postfix_54,(ParseNode *)0x0);
        pPVar7 = ParseNode::AsParseNodeSuperCall((ParseNode *)byteCodeGenerator_local);
        local_190 = postfix_local.m_fn;
        local_1a0 = pnode_local;
        local_198 = postfix_local.m_context;
        prefix_53.m_fn = p_Var31;
        prefix_53.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_53.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_53.m_context = (SymCheck *)pnode_local;
        local_188 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  ((ParseNode *)pPVar7->pnodeNewTarget,pBStack_38,prefix_53,postfix_53,
                   (ParseNode *)0x0);
      }
      break;
    case 0x36:
      pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
      alloc = (ArenaAllocator *)pPVar4->pnode1;
      if (((ParseNode *)alloc)->nop == knopComma) {
        rhsStack.allocator = ByteCodeGenerator::GetAllocator(pBStack_38);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::SList
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_808,
                   rhsStack.allocator);
        do {
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)alloc);
          SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                    ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_808,
                     &pPVar4->pnode2);
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)alloc);
          alloc = (ArenaAllocator *)pPVar4->pnode1;
        } while (((ParseNode *)alloc)->nop == knopComma);
        prefix_03.m_fn = p_Var31;
        prefix_03.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_05.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_05.m_context = (SymCheck *)pnode_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  ((ParseNode *)alloc,pBStack_38,prefix_03,postfix_05,(ParseNode *)0x0);
        while (bVar2 = SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Empty
                                 ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                                  local_808), ((bVar2 ^ 0xffU) & 1) != 0) {
          pPVar22 = SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Pop
                              ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_808);
          prefix_02.m_fn = p_Var31;
          prefix_02.m_context = (SymCheck *)postfix_local.m_fn;
          postfix_04.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
               postfix_local.m_context;
          postfix_04.m_context = (SymCheck *)pnode_local;
          Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    (pPVar22,pBStack_38,prefix_02,postfix_04,(ParseNode *)0x0);
        }
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_808);
      }
      else {
        prefix_01.m_fn = p_Var31;
        prefix_01.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_03.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_03.m_context = (SymCheck *)pnode_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  ((ParseNode *)alloc,pBStack_38,prefix_01,postfix_03,(ParseNode *)0x0);
      }
      pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
      prefix_00.m_fn = p_Var31;
      prefix_00.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_02.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_02.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar4->pnode2,pBStack_38,prefix_00,postfix_02,(ParseNode *)0x0);
      break;
    case 0x3d:
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      local_1b0 = postfix_local.m_fn;
      local_1c0 = pnode_local;
      local_1b8 = postfix_local.m_context;
      prefix_52.m_fn = p_Var31;
      prefix_52.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_52.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_52.m_context = (SymCheck *)pnode_local;
      local_1a8 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar8->pnodeTarget,pBStack_38,prefix_52,postfix_52,(ParseNode *)0x0);
      bVar2 = IsCallOfConstants((ParseNode *)byteCodeGenerator_local);
      if (!bVar2) {
        pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
        local_1d0 = postfix_local.m_fn;
        local_1e0 = pnode_local;
        local_1d8 = postfix_local.m_context;
        prefix_51.m_fn = p_Var31;
        prefix_51.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_51.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_51.m_context = (SymCheck *)pnode_local;
        local_1c8 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar8->pnodeArgs,pBStack_38,prefix_51,postfix_51,(ParseNode *)0x0);
      }
      break;
    case 0x3f:
      pPVar9 = ParseNode::AsParseNodeTri((ParseNode *)byteCodeGenerator_local);
      local_1f0 = postfix_local.m_fn;
      local_200 = pnode_local;
      local_1f8 = postfix_local.m_context;
      prefix_50.m_fn = p_Var31;
      prefix_50.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_50.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_50.m_context = (SymCheck *)pnode_local;
      local_1e8 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar9->pnode1,pBStack_38,prefix_50,postfix_50,(ParseNode *)0x0);
      pPVar9 = ParseNode::AsParseNodeTri((ParseNode *)byteCodeGenerator_local);
      local_210 = postfix_local.m_fn;
      local_220 = pnode_local;
      local_218 = postfix_local.m_context;
      prefix_49.m_fn = p_Var31;
      prefix_49.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_49.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_49.m_context = (SymCheck *)pnode_local;
      local_208 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar9->pnode2,pBStack_38,prefix_49,postfix_49,(ParseNode *)0x0);
      pPVar9 = ParseNode::AsParseNodeTri((ParseNode *)byteCodeGenerator_local);
      local_230 = postfix_local.m_fn;
      local_240 = pnode_local;
      local_238 = postfix_local.m_context;
      prefix_48.m_fn = p_Var31;
      prefix_48.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_48.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_48.m_context = (SymCheck *)pnode_local;
      local_228 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar9->pnode3,pBStack_38,prefix_48,postfix_48,(ParseNode *)0x0);
      break;
    case 0x50:
      local_250 = postfix_local.m_fn;
      local_260 = pnode_local;
      local_258 = postfix_local.m_context;
      prefix_47.m_fn = p_Var31;
      prefix_47.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_47.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_47.m_context = (SymCheck *)pnode_local;
      local_248 = p_Var31;
      VisitList<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)byteCodeGenerator_local,pBStack_38,prefix_47,postfix_47);
      break;
    case 0x51:
    case 0x52:
    case 0x53:
      pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
      if (pPVar10->pnodeInit != (ParseNodePtr)0x0) {
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
        local_270 = postfix_local.m_fn;
        local_280 = pnode_local;
        local_278 = postfix_local.m_context;
        prefix_46.m_fn = p_Var31;
        prefix_46.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_46.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_46.m_context = (SymCheck *)pnode_local;
        local_268 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar10->pnodeInit,pBStack_38,prefix_46,postfix_46,(ParseNode *)0x0);
      }
      break;
    case 0x55:
      break;
    case 0x56:
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      local_290 = postfix_local.m_fn;
      local_2a0 = pnode_local;
      local_298 = postfix_local.m_context;
      prefix_45.m_fn = p_Var31;
      prefix_45.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_45.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_45.m_context = (SymCheck *)pnode_local;
      local_288 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (&pPVar11->pnodeDeclName->super_ParseNode,pBStack_38,prefix_45,postfix_45,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar11->pnodeBlock,pBStack_38);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      local_2b0 = postfix_local.m_fn;
      local_2c0 = pnode_local;
      local_2b8 = postfix_local.m_context;
      prefix_44.m_fn = p_Var31;
      prefix_44.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_44.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_44.m_context = (SymCheck *)pnode_local;
      local_2a8 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar11->pnodeExtends,pBStack_38,prefix_44,postfix_44,(ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      local_2d0 = postfix_local.m_fn;
      local_2e0 = pnode_local;
      local_2d8 = postfix_local.m_context;
      prefix_43.m_fn = p_Var31;
      prefix_43.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_43.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_43.m_context = (SymCheck *)pnode_local;
      local_2c8 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (&pPVar11->pnodeName->super_ParseNode,pBStack_38,prefix_43,postfix_43,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      local_2f0 = postfix_local.m_fn;
      local_300 = pnode_local;
      local_2f8 = postfix_local.m_context;
      prefix_42.m_fn = p_Var31;
      prefix_42.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_42.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_42.m_context = (SymCheck *)pnode_local;
      local_2e8 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (&pPVar11->pnodeConstructor->super_ParseNode,pBStack_38,prefix_42,postfix_42,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      local_310 = postfix_local.m_fn;
      local_320 = pnode_local;
      local_318 = postfix_local.m_context;
      prefix_41.m_fn = p_Var31;
      prefix_41.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_41.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_41.m_context = (SymCheck *)pnode_local;
      local_308 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar11->pnodeMembers,pBStack_38,prefix_41,postfix_41,(ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar11->pnodeBlock,pBStack_38);
      break;
    case 0x57:
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      if (pPVar14->pnodeBody == (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x152,"(pnode->AsParseNodeFnc()->pnodeBody)",
                           "pnode->AsParseNodeFnc()->pnodeBody");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 0;
      }
      local_384 = 0;
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      prefix_37.m_fn = p_Var31;
      prefix_37.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_00.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_00.m_context = (SymCheck *)pnode_local;
      VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pPVar14->pnodeScopes,(ParseNode *)byteCodeGenerator_local,pBStack_38,
                 prefix_37,postfix_00,&local_384,false);
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar14->pnodeScopes,pBStack_38);
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      prefix_36.m_fn = p_Var31;
      prefix_36.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_37.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_37.m_context = (SymCheck *)pnode_local;
      pPVar22 = VisitBlock<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                          (pPVar14->pnodeBody,pBStack_38,prefix_36,postfix_37,(ParseNode *)0x0);
      pPVar16 = ParseNode::AsParseNodeProg((ParseNode *)byteCodeGenerator_local);
      pPVar16->pnodeLastValStmt = pPVar22;
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar14->pnodeScopes,pBStack_38);
      break;
    case 0x5b:
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar17->pnodeBlock,pBStack_38);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      prefix_35.m_fn = p_Var31;
      prefix_35.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_36.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_36.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar17->pnodeInit,pBStack_38,prefix_35,postfix_36,(ParseNode *)0x0);
      ByteCodeGenerator::EnterLoop(pBStack_38);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      prefix_34.m_fn = p_Var31;
      prefix_34.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_35.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_35.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar17->pnodeCond,pBStack_38,prefix_34,postfix_35,(ParseNode *)0x0);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      prefix_33.m_fn = p_Var31;
      prefix_33.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_34.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_34.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar17->pnodeIncr,pBStack_38,prefix_33,postfix_34,(ParseNode *)0x0);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      prefix_32.m_fn = p_Var31;
      prefix_32.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_33.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_33.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar17->pnodeBody,pBStack_38,prefix_32,postfix_33,
                 (ParseNode *)byteCodeGenerator_local);
      ByteCodeGenerator::ExitLoop(pBStack_38);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar17->pnodeBlock,pBStack_38);
      break;
    case 0x5c:
      pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
      prefix_31.m_fn = p_Var31;
      prefix_31.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_32.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_32.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar18->pnodeCond,pBStack_38,prefix_31,postfix_32,(ParseNode *)0x0);
      pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
      prefix_30.m_fn = p_Var31;
      prefix_30.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_31.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_31.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar18->pnodeTrue,pBStack_38,prefix_30,postfix_31,
                 (ParseNode *)byteCodeGenerator_local);
      pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
      if (pPVar18->pnodeFalse != (ParseNodePtr)0x0) {
        pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
        prefix_29.m_fn = p_Var31;
        prefix_29.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_30.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_30.m_context = (SymCheck *)pnode_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar18->pnodeFalse,pBStack_38,prefix_29,postfix_30,
                   (ParseNode *)byteCodeGenerator_local);
      }
      break;
    case 0x5d:
    case 0x5e:
      ByteCodeGenerator::EnterLoop(pBStack_38);
      pPVar19 = ParseNode::AsParseNodeWhile((ParseNode *)byteCodeGenerator_local);
      prefix_28.m_fn = p_Var31;
      prefix_28.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_29.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_29.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar19->pnodeCond,pBStack_38,prefix_28,postfix_29,(ParseNode *)0x0);
      pPVar19 = ParseNode::AsParseNodeWhile((ParseNode *)byteCodeGenerator_local);
      prefix_27.m_fn = p_Var31;
      prefix_27.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_28.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_28.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar19->pnodeBody,pBStack_38,prefix_27,postfix_28,
                 (ParseNode *)byteCodeGenerator_local);
      ByteCodeGenerator::ExitLoop(pBStack_38);
      break;
    case 0x5f:
    case 0x60:
    case 0x61:
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar20->pnodeBlock,pBStack_38);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      prefix_26.m_fn = p_Var31;
      prefix_26.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_27.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_27.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar20->pnodeLval,pBStack_38,prefix_26,postfix_27,(ParseNode *)0x0);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      prefix_25.m_fn = p_Var31;
      prefix_25.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_26.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_26.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar20->pnodeObj,pBStack_38,prefix_25,postfix_26,(ParseNode *)0x0);
      ByteCodeGenerator::EnterLoop(pBStack_38);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      prefix_24.m_fn = p_Var31;
      prefix_24.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_25.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_25.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar20->pnodeBody,pBStack_38,prefix_24,postfix_25,
                 (ParseNode *)byteCodeGenerator_local);
      ByteCodeGenerator::ExitLoop(pBStack_38);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar20->pnodeBlock,pBStack_38);
      break;
    case 0x62:
      pnode_01 = ParseNode::AsParseNodeBlock((ParseNode *)byteCodeGenerator_local);
      if (pnode_01->pnodeStmt == (ParseNodePtr)0x0) {
        pnode_01->pnodeLastValStmt = (ParseNodePtr)0x0;
      }
      else {
        BeginVisitBlock(pnode_01,pBStack_38);
        prefix_22.m_fn = p_Var31;
        prefix_22.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_23.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_23.m_context = (SymCheck *)pnode_local;
        pPVar22 = VisitBlock<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                            (pnode_01->pnodeStmt,pBStack_38,prefix_22,postfix_23,
                             (ParseNode *)byteCodeGenerator_local);
        pnode_01->pnodeLastValStmt = pPVar22;
        EndVisitBlock(pnode_01,pBStack_38);
      }
      break;
    case 99:
      pPVar12 = ParseNode::AsParseNodeStrTemplate((ParseNode *)byteCodeGenerator_local);
      if ((pPVar12->field_0x2a & 1) == 0) {
        pPVar12 = ParseNode::AsParseNodeStrTemplate((ParseNode *)byteCodeGenerator_local);
        local_330 = postfix_local.m_fn;
        local_340 = pnode_local;
        local_338 = postfix_local.m_context;
        prefix_40.m_fn = p_Var31;
        prefix_40.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_40.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_40.m_context = (SymCheck *)pnode_local;
        local_328 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar12->pnodeStringLiterals,pBStack_38,prefix_40,postfix_40,(ParseNode *)0x0);
      }
      pPVar12 = ParseNode::AsParseNodeStrTemplate((ParseNode *)byteCodeGenerator_local);
      local_350 = postfix_local.m_fn;
      local_360 = pnode_local;
      local_358 = postfix_local.m_context;
      prefix_39.m_fn = p_Var31;
      prefix_39.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_39.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_39.m_context = (SymCheck *)pnode_local;
      local_348 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar12->pnodeSubstitutionExpressions,pBStack_38,prefix_39,postfix_39,
                 (ParseNode *)0x0);
      break;
    case 100:
      pPVar23 = ParseNode::AsParseNodeWith((ParseNode *)byteCodeGenerator_local);
      prefix_21.m_fn = p_Var31;
      prefix_21.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_22.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_22.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar23->pnodeObj,pBStack_38,prefix_21,postfix_22,(ParseNode *)0x0);
      pnode_00 = byteCodeGenerator_local;
      pPVar23 = ParseNode::AsParseNodeWith((ParseNode *)byteCodeGenerator_local);
      prefix_20.m_fn = p_Var31;
      prefix_20.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_01.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_01.m_context = (SymCheck *)pnode_local;
      VisitWithStmt<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pnode_00,pPVar23->pnodeObj->location,pBStack_38,prefix_20,postfix_01,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x65:
      break;
    case 0x66:
      break;
    case 0x67:
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      prefix_19.m_fn = p_Var31;
      prefix_19.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_21.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_21.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar24->pnodeVal,pBStack_38,prefix_19,postfix_21,(ParseNode *)0x0);
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar24->pnodeBlock,pBStack_38);
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      for (local_5f8 = pPVar24->pnodeCases; local_5f8 != (ParseNodeCase *)0x0;
          local_5f8 = local_5f8->pnodeNext) {
        prefix_18.m_fn = p_Var31;
        prefix_18.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_20.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_20.m_context = (SymCheck *)pnode_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  ((ParseNode *)local_5f8,pBStack_38,prefix_18,postfix_20,
                   (ParseNode *)byteCodeGenerator_local);
      }
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      prefix_17.m_fn = p_Var31;
      prefix_17.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_19.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_19.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pPVar24->pnodeBlock,pBStack_38,prefix_17,postfix_19,(ParseNode *)0x0);
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar24->pnodeBlock,pBStack_38);
      break;
    case 0x68:
      pPVar25 = ParseNode::AsParseNodeCase((ParseNode *)byteCodeGenerator_local);
      prefix_16.m_fn = p_Var31;
      prefix_16.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_18.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_18.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar25->pnodeExpr,pBStack_38,prefix_16,postfix_18,(ParseNode *)0x0);
      pPVar25 = ParseNode::AsParseNodeCase((ParseNode *)byteCodeGenerator_local);
      prefix_15.m_fn = p_Var31;
      prefix_15.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_17.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_17.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pPVar25->pnodeBody,pBStack_38,prefix_15,postfix_17,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x69:
      pPVar27 = ParseNode::AsParseNodeTryCatch((ParseNode *)byteCodeGenerator_local);
      prefix_11.m_fn = p_Var31;
      prefix_11.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_13.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_13.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pPVar27->pnodeTry,pBStack_38,prefix_11,postfix_13,
                 (ParseNode *)byteCodeGenerator_local);
      pPVar27 = ParseNode::AsParseNodeTryCatch((ParseNode *)byteCodeGenerator_local);
      prefix_10.m_fn = p_Var31;
      prefix_10.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_12.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_12.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pPVar27->pnodeCatch,pBStack_38,prefix_10,postfix_12,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x6a:
      BeginVisitCatch((ParseNode *)byteCodeGenerator_local,pBStack_38);
      pPVar29 = ParseNode::AsParseNodeCatch((ParseNode *)byteCodeGenerator_local);
      pnode_02 = ParseNodeCatch::GetParam(pPVar29);
      prefix_08.m_fn = p_Var31;
      prefix_08.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_10.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_10.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pnode_02,pBStack_38,prefix_08,postfix_10,(ParseNode *)0x0);
      pPVar29 = ParseNode::AsParseNodeCatch((ParseNode *)byteCodeGenerator_local);
      prefix_07.m_fn = p_Var31;
      prefix_07.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_09.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_09.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar29->pnodeBody,pBStack_38,prefix_07,postfix_09,
                 (ParseNode *)byteCodeGenerator_local);
      EndVisitCatch((ParseNode *)byteCodeGenerator_local,pBStack_38);
      break;
    case 0x6b:
      pPVar21 = ParseNode::AsParseNodeReturn((ParseNode *)byteCodeGenerator_local);
      if (pPVar21->pnodeExpr != (ParseNodePtr)0x0) {
        pPVar21 = ParseNode::AsParseNodeReturn((ParseNode *)byteCodeGenerator_local);
        prefix_23.m_fn = p_Var31;
        prefix_23.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_24.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_24.m_context = (SymCheck *)pnode_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar21->pnodeExpr,pBStack_38,prefix_23,postfix_24,(ParseNode *)0x0);
      }
      break;
    case 0x6c:
      pPVar28 = ParseNode::AsParseNodeTry((ParseNode *)byteCodeGenerator_local);
      prefix_09.m_fn = p_Var31;
      prefix_09.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_11.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_11.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar28->pnodeBody,pBStack_38,prefix_09,postfix_11,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x6d:
      pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
      prefix_05.m_fn = p_Var31;
      prefix_05.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_07.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_07.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar3->pnode1,pBStack_38,prefix_05,postfix_07,(ParseNode *)0x0);
      break;
    case 0x6e:
      pPVar30 = ParseNode::AsParseNodeFinally((ParseNode *)byteCodeGenerator_local);
      prefix_06.m_fn = p_Var31;
      prefix_06.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_08.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_08.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar30->pnodeBody,pBStack_38,prefix_06,postfix_08,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x6f:
      pPVar26 = ParseNode::AsParseNodeTryFinally((ParseNode *)byteCodeGenerator_local);
      prefix_13.m_fn = p_Var31;
      prefix_13.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_15.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_15.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pPVar26->pnodeTry,pBStack_38,prefix_13,postfix_15,
                 (ParseNode *)byteCodeGenerator_local);
      pPVar26 = ParseNode::AsParseNodeTryFinally((ParseNode *)byteCodeGenerator_local);
      prefix_12.m_fn = p_Var31;
      prefix_12.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_14.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_14.m_context = (SymCheck *)pnode_local;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((ParseNode *)pPVar26->pnodeFinally,pBStack_38,prefix_12,postfix_14,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x72:
      bVar2 = ByteCodeGenerator::InDestructuredPattern(pBStack_38);
      if (bVar2) {
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        local_110 = postfix_local.m_fn;
        local_120 = pnode_local;
        local_118 = postfix_local.m_context;
        prefix_57.m_fn = p_Var31;
        prefix_57.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_57.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_57.m_context = (SymCheck *)pnode_local;
        local_108 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar3->pnode1,pBStack_38,prefix_57,postfix_57,(ParseNode *)0x0);
      }
      else {
        ByteCodeGenerator::SetInDestructuredPattern(pBStack_38,true);
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        local_f0 = postfix_local.m_fn;
        local_100 = pnode_local;
        local_f8 = postfix_local.m_context;
        prefix_58.m_fn = p_Var31;
        prefix_58.m_context = (SymCheck *)postfix_local.m_fn;
        postfix_58.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
        postfix_58.m_context = (SymCheck *)pnode_local;
        local_e8 = p_Var31;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar3->pnode1,pBStack_38,prefix_58,postfix_58,(ParseNode *)0x0);
        ByteCodeGenerator::SetInDestructuredPattern(pBStack_38,false);
      }
      break;
    case 0x73:
      pPVar6 = ParseNode::AsParseNodeParamPattern((ParseNode *)byteCodeGenerator_local);
      local_d0 = postfix_local.m_fn;
      local_e0 = pnode_local;
      local_d8 = postfix_local.m_context;
      prefix_59.m_fn = p_Var31;
      prefix_59.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_59.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_59.m_context = (SymCheck *)pnode_local;
      local_c8 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                ((pPVar6->super_ParseNodeUni).pnode1,pBStack_38,prefix_59,postfix_59,
                 (ParseNode *)0x0);
      break;
    case 0x74:
      pPVar13 = ParseNode::AsParseNodeExportDefault((ParseNode *)byteCodeGenerator_local);
      local_370 = postfix_local.m_fn;
      pPStack_380 = pnode_local;
      local_378 = postfix_local.m_context;
      prefix_38.m_fn = p_Var31;
      prefix_38.m_context = (SymCheck *)postfix_local.m_fn;
      postfix_38.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)postfix_local.m_context;
      postfix_38.m_context = (SymCheck *)pnode_local;
      local_368 = p_Var31;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar13->pnodeExpr,pBStack_38,prefix_38,postfix_38,(ParseNode *)0x0);
    }
    if (pnodeParent != (ParseNode *)0x0) {
      PropagateFlags((ParseNode *)byteCodeGenerator_local,pnodeParent);
    }
    ParseNodeVisitor<SymCheck>::operator()
              ((ParseNodeVisitor<SymCheck> *)&pnode_local,(ParseNode *)byteCodeGenerator_local,
               pBStack_38);
  }
  return;
}

Assistant:

void Visit(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    if (pnode == nullptr)
    {
        return;
    }

    ThreadContext::ProbeCurrentStackNoDispose(Js::Constants::MinStackByteCodeVisitor, byteCodeGenerator->GetScriptContext());

    prefix(pnode, byteCodeGenerator);
    switch (pnode->nop)
    {
    default:
    {
        uint flags = ParseNode::Grfnop(pnode->nop);
        if (flags&fnopUni)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        else if (flags&fnopBin)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);

            if (ByteCodeGenerator::IsSuper(pnode->AsParseNodeBin()->pnode1))
            {
                Visit(pnode->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, prefix, postfix);
            }
        }

        break;
    }

    case knopParamPattern:
        Visit(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator, prefix, postfix);
        break;

    case knopArrayPattern:
        if (!byteCodeGenerator->InDestructuredPattern())
        {
            byteCodeGenerator->SetInDestructuredPattern(true);
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
            byteCodeGenerator->SetInDestructuredPattern(false);
        }
        else
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopCall:
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);

        if (pnode->AsParseNodeCall()->isSuperCall)
        {
            Visit(pnode->AsParseNodeSuperCall()->pnodeThis, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeSuperCall()->pnodeNewTarget, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopNew:
    {
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        if (!IsCallOfConstants(pnode))
        {
            Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);
        }
        break;
    }

    case knopQmark:
        Visit(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator, prefix, postfix);
        break;
    case knopList:
        VisitList(pnode, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        if (pnode->AsParseNodeVar()->pnodeInit != nullptr)
            Visit(pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
    case knopFncDecl:
    {
        // Inner function declarations are visited before anything else in the scope.
        // (See VisitFunctionsInScope.)
        break;
    }
    case knopClassDecl:
    {
        Visit(pnode->AsParseNodeClass()->pnodeDeclName, byteCodeGenerator, prefix, postfix);
        // Now visit the class name and methods.
        BeginVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        // The extends clause is bound to the scope which contains the class name
        // (and the class name identifier is in a TDZ when the extends clause is evaluated).
        // See ES 2017 14.5.13 Runtime Semantics: ClassDefinitionEvaluation.
        Visit(pnode->AsParseNodeClass()->pnodeExtends, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeName, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeConstructor, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeMembers, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        break;
    }
    case knopStrTemplate:
    {
        // Visit the string node lists only if we do not have a tagged template.
        // We never need to visit the raw strings as they are not used in non-tagged templates and
        // tagged templates will register them as part of the callsite constant object.
        if (!pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
        {
            Visit(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions, byteCodeGenerator, prefix, postfix);
        break;
    }
    case knopExportDefault:
        Visit(pnode->AsParseNodeExportDefault()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
    case knopProg:
    {
        // We expect that the global statements have been generated (meaning that the pnodeFncs
        // field is a real pointer, not an enumeration).
        Assert(pnode->AsParseNodeFnc()->pnodeBody);

        uint i = 0;
        VisitNestedScopes(pnode->AsParseNodeFnc()->pnodeScopes, pnode, byteCodeGenerator, prefix, postfix, &i);
        // Visiting global code: track the last value statement.
        BeginVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);
        pnode->AsParseNodeProg()->pnodeLastValStmt = VisitBlock(pnode->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);

        break;
    }
    case knopFor:
        BeginVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeFor()->pnodeInit, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeFor()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeIncr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
    case knopIf:
        Visit(pnode->AsParseNodeIf()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeIf()->pnodeTrue, byteCodeGenerator, prefix, postfix, pnode);
        if (pnode->AsParseNodeIf()->pnodeFalse != nullptr)
        {
            Visit(pnode->AsParseNodeIf()->pnodeFalse, byteCodeGenerator, prefix, postfix, pnode);
        }
        break;
    // PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
    // PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
    case knopDoWhile:
    case knopWhile:
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeWhile()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeWhile()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        break;
    // PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
        BeginVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeLval, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
    case knopReturn:
        if (pnode->AsParseNodeReturn()->pnodeExpr != nullptr)
            Visit(pnode->AsParseNodeReturn()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
    case knopBlock:
    {
        ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
        if (pnodeBlock->pnodeStmt != nullptr)
        {
            BeginVisitBlock(pnodeBlock, byteCodeGenerator);
            pnodeBlock->pnodeLastValStmt = VisitBlock(pnodeBlock->pnodeStmt, byteCodeGenerator, prefix, postfix, pnode);
            EndVisitBlock(pnodeBlock, byteCodeGenerator);
        }
        else
        {
            pnodeBlock->pnodeLastValStmt = nullptr;
        }
        break;
    }
    // PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
    case knopWith:
        Visit(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator, prefix, postfix);
        VisitWithStmt(pnode, pnode->AsParseNodeWith()->pnodeObj->location, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopBreak      , "break"        ,None    ,Jump ,fnopNone)
    case knopBreak:
        // TODO: some representation of target
        break;
    // PTNODE(knopContinue   , "continue"    ,None    ,Jump ,fnopNone)
    case knopContinue:
        // TODO: some representation of target
        break;
    // PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
    case knopSwitch:
        Visit(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator, prefix, postfix);
        BeginVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        for (ParseNodeCase *pnodeT = pnode->AsParseNodeSwitch()->pnodeCases; nullptr != pnodeT; pnodeT = pnodeT->pnodeNext)
        {
            Visit(pnodeT, byteCodeGenerator, prefix, postfix, pnode);
        }
        Visit(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
    case knopCase:
        Visit(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCase()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopTypeof:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopTryCatchFinally,"try-catch-finally",None,TryCatchFinally,fnopCleanup)
    case knopTryFinally:
        Visit(pnode->AsParseNodeTryFinally()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryFinally()->pnodeFinally, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
    case knopTryCatch:
        Visit(pnode->AsParseNodeTryCatch()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryCatch()->pnodeCatch, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
    case knopTry:
        Visit(pnode->AsParseNodeTry()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopCatch:
        BeginVisitCatch(pnode, byteCodeGenerator);
        Visit(pnode->AsParseNodeCatch()->GetParam(), byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCatch()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        EndVisitCatch(pnode, byteCodeGenerator);
        break;
    case knopFinally:
        Visit(pnode->AsParseNodeFinally()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
    case knopThrow:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    case knopArray:
    {
        bool arrayLitOpt = EmitAsConstantArray(pnode, byteCodeGenerator);
        if (!arrayLitOpt)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;
    }
    case knopComma:
    {
        ParseNode *pnode1 = pnode->AsParseNodeBin()->pnode1;
        if (pnode1->nop == knopComma)
        {
            // Spot-fix to avoid recursion on very large comma expressions.
            ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
            SList<ParseNode*> rhsStack(alloc);
            do
            {
                rhsStack.Push(pnode1->AsParseNodeBin()->pnode2);
                pnode1 = pnode1->AsParseNodeBin()->pnode1;
            }
            while (pnode1->nop == knopComma);

            Visit(pnode1, byteCodeGenerator, prefix, postfix);
            while (!rhsStack.Empty())
            {
                ParseNode *pnodeRhs = rhsStack.Pop();
                Visit(pnodeRhs, byteCodeGenerator, prefix, postfix);
            }
        }
        else
        {
            Visit(pnode1, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);
    }
        break;
    }
    if (pnodeParent)
    {
        PropagateFlags(pnode, pnodeParent);
    }
    postfix(pnode, byteCodeGenerator);
}